

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O1

CURLcode setstropt_userpwd(char *option,char **userp,char **passwdp)

{
  CURLcode CVar1;
  size_t len;
  bool bVar2;
  char *passwd;
  char *user;
  char *local_28;
  char *local_20;
  
  local_20 = (char *)0x0;
  local_28 = (char *)0x0;
  if (option != (char *)0x0) {
    len = strlen(option);
    if (len < 0x7a1201) {
      CVar1 = Curl_parse_login_details(option,len,&local_20,&local_28,(char **)0x0);
      bVar2 = CVar1 == CURLE_OK;
    }
    else {
      CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
      bVar2 = false;
    }
    if (!bVar2) {
      return CVar1;
    }
  }
  (*Curl_cfree)(*userp);
  *userp = local_20;
  (*Curl_cfree)(*passwdp);
  *passwdp = local_28;
  return CURLE_OK;
}

Assistant:

static CURLcode setstropt_userpwd(char *option, char **userp, char **passwdp)
{
  char *user = NULL;
  char *passwd = NULL;

  DEBUGASSERT(userp);
  DEBUGASSERT(passwdp);

  /* Parse the login details if specified. It not then we treat NULL as a hint
     to clear the existing data */
  if(option) {
    size_t len = strlen(option);
    CURLcode result;
    if(len > CURL_MAX_INPUT_LENGTH)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    result = Curl_parse_login_details(option, len, &user, &passwd, NULL);
    if(result)
      return result;
  }

  free(*userp);
  *userp = user;

  free(*passwdp);
  *passwdp = passwd;

  return CURLE_OK;
}